

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

iterator __thiscall
google::protobuf::RepeatedField<int>::erase(RepeatedField<int> *this,const_iterator position)

{
  iterator piVar1;
  
  piVar1 = erase(this,position,position + 1);
  return piVar1;
}

Assistant:

inline typename RepeatedField<Element>::iterator RepeatedField<Element>::erase(
    const_iterator position) {
  return erase(position, position + 1);
}